

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int ctl_bymib(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
             size_t newlen)

{
  ctl_node_t *pcVar1;
  _Bool _Var2;
  int iVar3;
  ctl_named_node_t *pcVar4;
  size_t sVar5;
  
  if ((ctl_initialized == '\0') && (_Var2 = ctl_init(tsd), _Var2)) {
    return 0xb;
  }
  pcVar4 = super_root_node;
  if (miblen != 0) {
    sVar5 = 0;
    do {
      pcVar1 = pcVar4->children;
      if (pcVar1->named == true) {
        if (pcVar4->nchildren <= mib[sVar5]) {
          return 2;
        }
        pcVar4 = (ctl_named_node_t *)(pcVar1 + mib[sVar5] * 0x28);
      }
      else {
        pcVar4 = (ctl_named_node_t *)(**(code **)(pcVar1 + 8))(tsd,mib,miblen);
        if (pcVar4 == (ctl_named_node_t *)0x0) {
          return 2;
        }
      }
      sVar5 = sVar5 + 1;
    } while (miblen != sVar5);
  }
  if ((pcVar4 != (ctl_named_node_t *)0x0) &&
     (pcVar4->ctl !=
      (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
    iVar3 = (*pcVar4->ctl)(tsd,mib,miblen,oldp,oldlenp,newp,newlen);
    return iVar3;
  }
  return 2;
}

Assistant:

int
ctl_bymib(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const ctl_named_node_t *node;
	size_t i;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	/* Iterate down the tree. */
	node = super_root_node;
	for (i = 0; i < miblen; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			/* Children are named. */
			if (node->nchildren <= mib[i]) {
				ret = ENOENT;
				goto label_return;
			}
			node = ctl_named_children(node, mib[i]);
		} else {
			const ctl_indexed_node_t *inode;

			/* Indexed element. */
			inode = ctl_indexed_node(node->children);
			node = inode->index(tsd_tsdn(tsd), mib, miblen, mib[i]);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}
		}
	}

	/* Call the ctl function. */
	if (node && node->ctl) {
		ret = node->ctl(tsd, mib, miblen, oldp, oldlenp, newp, newlen);
	} else {
		/* Partial MIB. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}